

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digraph.hxx
# Opt level: O0

void __thiscall
andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertAdjacenciesForEdge
          (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this,size_t edgeIndex)

{
  size_type in_RSI;
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  *in_RDI;
  pair<__gnu_cxx::__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool>
  pVar1;
  value_type *in_stack_00000008;
  RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  *in_stack_00000010;
  size_t vertexIndex1;
  size_t vertexIndex0;
  Edge *edge;
  Adjacency<unsigned_long> local_58;
  Adjacency<unsigned_long> *local_48;
  undefined1 local_40;
  Adjacency<unsigned_long> local_38;
  Value local_28;
  size_type local_20;
  Edge<true,_unsigned_long> *local_18;
  size_type local_10;
  
  local_10 = in_RSI;
  local_18 = std::
             vector<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
             ::operator[]((vector<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                           *)(in_RDI + 1),in_RSI);
  local_20 = detail::Edge<true,_unsigned_long>::operator[](local_18,0);
  local_28 = detail::Edge<true,_unsigned_long>::operator[](local_18,1);
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::operator[](in_RDI,local_20);
  Adjacency<unsigned_long>::Adjacency(&local_38,local_28,local_10);
  pVar1 = RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ::insert(in_stack_00000010,in_stack_00000008);
  local_48 = (Adjacency<unsigned_long> *)pVar1.first._M_current;
  local_40 = pVar1.second;
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::operator[](in_RDI,local_28);
  Adjacency<unsigned_long>::Adjacency(&local_58,local_20,local_10);
  RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ::insert(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

inline void
Digraph<VISITOR>::insertAdjacenciesForEdge(
    const std::size_t edgeIndex
) {
    const Edge& edge = edges_[edgeIndex];
    const std::size_t vertexIndex0 = edge[0];
    const std::size_t vertexIndex1 = edge[1];
    vertices_[vertexIndex0].to_.insert(
        AdjacencyType(vertexIndex1, edgeIndex)
    );
    vertices_[vertexIndex1].from_.insert(
        AdjacencyType(vertexIndex0, edgeIndex)
    );
}